

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transformable.cpp
# Opt level: O0

Transform * __thiscall sf::Transformable::getTransform(Transformable *this)

{
  long in_RDI;
  double dVar1;
  float ty;
  float tx;
  float sys;
  float sxs;
  float syc;
  float sxc;
  float sine;
  float cosine;
  float angle;
  Transform local_6c;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  if ((*(byte *)(in_RDI + 100) & 1) != 0) {
    local_c = (-*(float *)(in_RDI + 0x18) * 3.1415927) / 180.0;
    dVar1 = std::cos((double)(ulong)(uint)local_c);
    local_10 = SUB84(dVar1,0);
    dVar1 = std::sin((double)(ulong)(uint)local_c);
    local_14 = SUB84(dVar1,0);
    local_18 = *(float *)(in_RDI + 0x1c) * local_10;
    local_1c = *(float *)(in_RDI + 0x20) * local_10;
    local_20 = *(float *)(in_RDI + 0x1c) * local_14;
    local_24 = *(float *)(in_RDI + 0x20) * local_14;
    local_28 = -*(float *)(in_RDI + 8) * local_18 + -(*(float *)(in_RDI + 0xc) * local_24) +
               *(float *)(in_RDI + 0x10);
    local_2c = *(float *)(in_RDI + 8) * local_20 + -(*(float *)(in_RDI + 0xc) * local_1c) +
               *(float *)(in_RDI + 0x14);
    Transform::Transform
              (&local_6c,local_18,local_24,local_28,-local_20,local_1c,local_2c,0.0,0.0,1.0);
    memcpy((void *)(in_RDI + 0x24),&local_6c,0x40);
    *(undefined1 *)(in_RDI + 100) = 0;
  }
  return (Transform *)(in_RDI + 0x24);
}

Assistant:

const Transform& Transformable::getTransform() const
{
    // Recompute the combined transform if needed
    if (m_transformNeedUpdate)
    {
        float angle  = -m_rotation * 3.141592654f / 180.f;
        float cosine = std::cos(angle);
        float sine   = std::sin(angle);
        float sxc    = m_scale.x * cosine;
        float syc    = m_scale.y * cosine;
        float sxs    = m_scale.x * sine;
        float sys    = m_scale.y * sine;
        float tx     = -m_origin.x * sxc - m_origin.y * sys + m_position.x;
        float ty     =  m_origin.x * sxs - m_origin.y * syc + m_position.y;

        m_transform = Transform( sxc, sys, tx,
                                -sxs, syc, ty,
                                 0.f, 0.f, 1.f);
        m_transformNeedUpdate = false;
    }

    return m_transform;
}